

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetCommand.cxx
# Opt level: O2

bool __thiscall
cmSetCommand::InitialPass
          (cmSetCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  CacheEntryType type;
  CacheEntryType CVar7;
  size_t sVar8;
  char *__dest;
  char *pcVar9;
  ulong uVar10;
  cmState *this_00;
  pointer pbVar11;
  pointer pbVar12;
  uint uVar13;
  long lVar14;
  bool bVar15;
  char *variable;
  string local_90;
  string value;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_50;
  pointer local_40;
  ulong local_38;
  
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish == pbVar11) {
    std::__cxx11::string::string
              ((string *)&value,"called with incorrect number of arguments",(allocator *)&local_90);
    cmCommand::SetError(&this->super_cmCommand,&value);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  variable = (pbVar11->_M_dataplus)._M_p;
  bVar2 = cmHasLiteralPrefix<char_const*,5ul>(&variable,(char (*) [5])"ENV{");
  pcVar9 = variable;
  if ((bVar2) && (sVar8 = strlen(variable), 5 < sVar8)) {
    __dest = (char *)operator_new__(sVar8);
    sVar8 = strlen(pcVar9);
    strncpy(__dest,pcVar9 + 4,sVar8 - 5);
    sVar8 = strlen(pcVar9);
    __dest[sVar8 - 5] = '\0';
    std::__cxx11::string::string((string *)&value,__dest,(allocator *)&local_90);
    std::__cxx11::string::append((char *)&value);
    pcVar9 = getenv(__dest);
    operator_delete__(__dest);
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((ulong)((long)(args->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11) < 0x21) ||
       (pbVar11[1]._M_string_length == 0)) {
      if (pcVar9 == (char *)0x0) goto LAB_003c8285;
    }
    else {
      if ((pcVar9 != (char *)0x0) &&
         (iVar5 = strcmp(pcVar9,pbVar11[1]._M_dataplus._M_p), iVar5 == 0)) goto LAB_003c8285;
      std::__cxx11::string::append((string *)&value);
    }
    cmsys::SystemTools::PutEnv(&value);
LAB_003c8285:
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  pbVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  pbVar12 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (long)pbVar12 - (long)pbVar11;
  if ((long)uVar10 >> 5 == 2) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)pbVar11 + (uVar10 - 0x20)),"PARENT_SCOPE");
    if (bVar2) {
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::string::string((string *)&value,variable,(allocator *)&local_90);
      cmMakefile::RaiseScope(pcVar1,&value,(char *)0x0);
      goto LAB_003c8285;
    }
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (long)pbVar12 - (long)pbVar11;
  }
  else if ((long)uVar10 >> 5 == 1) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&value,variable,(allocator *)&local_90);
    cmMakefile::RemoveDefinition(pcVar1,&value);
    goto LAB_003c8285;
  }
  value._M_dataplus._M_p = (pointer)&value.field_2;
  value._M_string_length = 0;
  value.field_2._M_local_buf[0] = '\0';
  if (uVar10 < 0x21) {
LAB_003c8324:
    bVar3 = false;
    uVar13 = 0;
LAB_003c8327:
    if ((ulong)((long)uVar10 >> 5) < 4) {
      bVar4 = false;
      bVar2 = false;
    }
    else {
      bVar4 = std::operator==(pbVar11 + (((long)uVar10 >> 5) - (ulong)bVar3) + -3,"CACHE");
      uVar6 = uVar13 + 3;
      if (!bVar4) {
        uVar6 = uVar13;
      }
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      bVar2 = false;
      uVar13 = uVar6;
    }
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&pbVar11[-1]._M_dataplus._M_p + uVar10),"PARENT_SCOPE");
    pbVar11 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar12 = (args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    bVar3 = false;
    if (!bVar2) {
      uVar10 = (long)pbVar12 - (long)pbVar11;
      if (uVar10 < 0x81) goto LAB_003c8324;
      bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)pbVar11 + (uVar10 - 0x20)),"FORCE");
      uVar13 = (uint)bVar3;
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      pbVar12 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      uVar10 = (long)pbVar12 - (long)pbVar11;
      goto LAB_003c8327;
    }
    bVar2 = true;
    bVar4 = false;
    uVar13 = 1;
  }
  local_50.Begin._M_current = pbVar11 + 1;
  local_50.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)pbVar12 - (ulong)(uVar13 << 5));
  cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_90,&local_50,";");
  std::__cxx11::string::operator=((string *)&value,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  if (bVar2) {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::string::string((string *)&local_90,variable,(allocator *)&local_50);
    cmMakefile::RaiseScope(pcVar1,&local_90,value._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_90);
    bVar15 = true;
  }
  else {
    bVar2 = std::operator==((args->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish + -1,"CACHE");
    if (!bVar2) {
      pbVar11 = (args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      uVar10 = (long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11;
      if (((uVar10 < 0x21) ||
          (bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)pbVar11 + (uVar10 - 0x40)),"CACHE"), !bVar2)) &&
         (bVar3 != true || bVar4 != false)) {
        local_38 = (ulong)bVar3;
        if (bVar4 == false) {
          type = STRING;
          local_40 = (pointer)0x0;
        }
        else {
          pbVar11 = (args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar14 = ((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar11 >> 5) -
                   local_38;
          type = cmState::StringToCacheEntryType(pbVar11[lVar14 + -2]._M_dataplus._M_p);
          local_40 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start[lVar14 + -1]._M_dataplus._M_p;
        }
        this_00 = cmMakefile::GetState((this->super_cmCommand).Makefile);
        std::__cxx11::string::string((string *)&local_90,variable,(allocator *)&local_50);
        pcVar9 = cmState::GetCacheEntryValue(this_00,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        if (pcVar9 == (char *)0x0) {
          bVar2 = false;
        }
        else {
          std::__cxx11::string::string((string *)&local_90,variable,(allocator *)&local_50);
          CVar7 = cmState::GetCacheEntryType(this_00,&local_90);
          bVar2 = CVar7 != UNINITIALIZED;
          std::__cxx11::string::~string((string *)&local_90);
        }
        bVar15 = true;
        if ((bVar3 != false) || ((bVar2 & bVar4 & type != INTERNAL) == 0)) {
          pcVar1 = (this->super_cmCommand).Makefile;
          if (bVar4 == false) {
            std::__cxx11::string::string((string *)&local_90,variable,(allocator *)&local_50);
            cmMakefile::AddDefinition(pcVar1,&local_90,value._M_dataplus._M_p);
          }
          else {
            std::__cxx11::string::string((string *)&local_90,variable,(allocator *)&local_50);
            cmMakefile::AddCacheDefinition
                      (pcVar1,&local_90,value._M_dataplus._M_p,local_40,type,SUB81(local_38,0));
          }
          std::__cxx11::string::~string((string *)&local_90);
        }
        goto LAB_003c84b6;
      }
    }
    std::__cxx11::string::string
              ((string *)&local_90,"given invalid arguments for CACHE mode.",(allocator *)&local_50)
    ;
    cmCommand::SetError(&this->super_cmCommand,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    bVar15 = false;
  }
LAB_003c84b6:
  std::__cxx11::string::~string((string *)&value);
  return bVar15;
}

Assistant:

bool cmSetCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if(args.size() < 1 )
    {
    this->SetError("called with incorrect number of arguments");
    return false;
    }

  // watch for ENV signatures
  const char* variable = args[0].c_str(); // VAR is always first
  if (cmHasLiteralPrefix(variable, "ENV{") && strlen(variable) > 5)
    {
    // what is the variable name
    char *varName = new char [strlen(variable)];
    strncpy(varName,variable+4,strlen(variable)-5);
    varName[strlen(variable)-5] = '\0';
    std::string putEnvArg = varName;
    putEnvArg += "=";

    // what is the current value if any
    const char *currValue = getenv(varName);
    delete [] varName;

    // will it be set to something, then set it
    if (args.size() > 1 && !args[1].empty())
      {
      // but only if it is different from current value
      if (!currValue || strcmp(currValue,args[1].c_str()))
        {
        putEnvArg += args[1];
        cmSystemTools::PutEnv(putEnvArg);
        }
      return true;
      }

    // if it will be cleared, then clear it if it isn't already clear
    if (currValue)
      {
      cmSystemTools::PutEnv(putEnvArg);
      }
    return true;
    }

  // SET (VAR) // Removes the definition of VAR.
  if (args.size() == 1)
    {
    this->Makefile->RemoveDefinition(variable);
    return true;
    }
  // SET (VAR PARENT_SCOPE) // Removes the definition of VAR
                            // in the parent scope.
  else if (args.size() == 2 && args[args.size()-1] == "PARENT_SCOPE")
    {
    this->Makefile->RaiseScope(variable, 0);
    return true;
    }

  // here are the remaining options
  //  SET (VAR value )
  //  SET (VAR value PARENT_SCOPE)
  //  SET (VAR CACHE TYPE "doc String" [FORCE])
  //  SET (VAR value CACHE TYPE "doc string" [FORCE])
  std::string value;  // optional
  bool cache = false; // optional
  bool force = false; // optional
  bool parentScope = false;
  cmState::CacheEntryType type
    = cmState::STRING; // required if cache
  const char* docstring = 0; // required if cache

  unsigned int ignoreLastArgs = 0;
  // look for PARENT_SCOPE argument
  if (args.size() > 1 && args[args.size()-1] == "PARENT_SCOPE")
    {
    parentScope = true;
    ignoreLastArgs++;
    }
  else
    {
    // look for FORCE argument
    if (args.size() > 4 && args[args.size()-1] == "FORCE")
      {
      force = true;
      ignoreLastArgs++;
      }

    // check for cache signature
    if (args.size() > 3 && args[args.size() - 3 - (force ? 1 : 0)] == "CACHE")
      {
      cache = true;
      ignoreLastArgs+=3;
      }
    }

  // collect any values into a single semi-colon separated value list
  value = cmJoin(cmMakeRange(args).advance(1).retreat(ignoreLastArgs), ";");

  if (parentScope)
    {
    this->Makefile->RaiseScope(variable, value.c_str());
    return true;
    }


  // we should be nice and try to catch some simple screwups if the last or
  // next to last args are CACHE then they screwed up.  If they used FORCE
  // without CACHE they screwed up
  if ((args[args.size() - 1] == "CACHE") ||
      (args.size() > 1 && args[args.size() - 2] == "CACHE") ||
      (force && !cache))
    {
    this->SetError("given invalid arguments for CACHE mode.");
    return false;
    }

  if(cache)
    {
    std::string::size_type cacheStart = args.size() - 3 - (force ? 1 : 0);
    type = cmState::StringToCacheEntryType(args[cacheStart+1].c_str());
    docstring = args[cacheStart+2].c_str();
    }

  // see if this is already in the cache
  cmState* state = this->Makefile->GetState();
  const char* existingValue = state->GetCacheEntryValue(variable);
  if(existingValue &&
      (state->GetCacheEntryType(variable) != cmState::UNINITIALIZED))
    {
    // if the set is trying to CACHE the value but the value
    // is already in the cache and the type is not internal
    // then leave now without setting any definitions in the cache
    // or the makefile
    if(cache && type != cmState::INTERNAL && !force)
      {
      return true;
      }
    }

  // if it is meant to be in the cache then define it in the cache
  if(cache)
    {
    this->Makefile->AddCacheDefinition(variable,
                                   value.c_str(),
                                   docstring,
                                   type, force);
    }
  else
    {
    // add the definition
    this->Makefile->AddDefinition(variable, value.c_str());
    }
  return true;
}